

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partitioned_tuple_data.cpp
# Opt level: O2

void __thiscall
duckdb::PartitionedTupleData::Append
          (PartitionedTupleData *this,PartitionedTupleDataAppendState *state,
          TupleDataChunkState *input,idx_t append_count)

{
  Vector *this_00;
  pointer pTVar1;
  int iVar2;
  SelectionVector *pSVar3;
  undefined4 extraout_var;
  idx_t iVar4;
  type this_01;
  idx_t iVar5;
  optional_idx partition_index;
  optional_idx local_38;
  
  (*this->_vptr_PartitionedTupleData[4])
            (this,&input->row_locations,append_count,state,&state->utility_vector);
  pSVar3 = FlatVector::IncrementalSelectionVector();
  BuildPartitionSel(this,state,pSVar3,append_count);
  iVar2 = (*this->_vptr_PartitionedTupleData[5])(this);
  local_38 = PartitionedTupleDataAppendState::GetPartitionIndexIfSinglePartition
                       (state,CONCAT44(extraout_var,iVar2) < 0x100);
  if (local_38.index == 0xffffffffffffffff) {
    this_00 = &(state->chunk_state).heap_sizes;
    pSVar3 = &state->partition_sel;
    Vector::Slice(this_00,&input->heap_sizes,pSVar3,append_count);
    Vector::Flatten(this_00,append_count);
    BuildBufferSpace(this,state);
    this_01 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
              ::operator->((this->partitions).
                           super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
  }
  else {
    iVar4 = optional_idx::GetIndex(&local_38);
    this_01 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
              ::operator*((this->partitions).
                          super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                          .
                          super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + iVar4);
    iVar4 = optional_idx::GetIndex(&local_38);
    pTVar1 = (state->partition_pin_states).
             super_vector<duckdb::TupleDataPinState,_std::allocator<duckdb::TupleDataPinState>_>.
             super__Vector_base<duckdb::TupleDataPinState,_std::allocator<duckdb::TupleDataPinState>_>
             ._M_impl.super__Vector_impl_data._M_start;
    Vector::Reference(&(state->chunk_state).heap_sizes,&input->heap_sizes);
    iVar5 = TupleDataCollection::SizeInBytes(this_01);
    TupleDataCollection::Build(this_01,pTVar1 + iVar4,&state->chunk_state,0,append_count);
    iVar4 = TupleDataCollection::SizeInBytes(this_01);
    this->data_size = this->data_size + (iVar4 - iVar5);
    pSVar3 = FlatVector::IncrementalSelectionVector();
  }
  TupleDataCollection::CopyRows(this_01,&state->chunk_state,input,pSVar3,append_count);
  this->count = this->count + append_count;
  return;
}

Assistant:

void PartitionedTupleData::Append(PartitionedTupleDataAppendState &state, TupleDataChunkState &input,
                                  const idx_t append_count) {
	// Compute partition indices and store them in state.partition_indices
	ComputePartitionIndices(input.row_locations, append_count, state.partition_indices, state.utility_vector);

	// Build the selection vector for the partitions
	BuildPartitionSel(state, *FlatVector::IncrementalSelectionVector(), append_count);

	// Early out: check if everything belongs to a single partition
	auto partition_index = state.GetPartitionIndexIfSinglePartition(UseFixedSizeMap());
	if (partition_index.IsValid()) {
		auto &partition = *partitions[partition_index.GetIndex()];
		auto &partition_pin_state = state.partition_pin_states[partition_index.GetIndex()];

		state.chunk_state.heap_sizes.Reference(input.heap_sizes);

		const auto size_before = partition.SizeInBytes();
		partition.Build(partition_pin_state, state.chunk_state, 0, append_count);
		data_size += partition.SizeInBytes() - size_before;

		partition.CopyRows(state.chunk_state, input, *FlatVector::IncrementalSelectionVector(), append_count);
	} else {
		// Build the buffer space
		state.chunk_state.heap_sizes.Slice(input.heap_sizes, state.partition_sel, append_count);
		state.chunk_state.heap_sizes.Flatten(append_count);
		BuildBufferSpace(state);

		// Copy the rows
		partitions[0]->CopyRows(state.chunk_state, input, state.partition_sel, append_count);
	}

	count += append_count;
	Verify();
}